

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxSerialize.cpp
# Opt level: O0

void __thiscall Jinx::Impl::BinaryReader::Read(BinaryReader *this,BufferPtr *val)

{
  element_type *peVar1;
  uint local_1c;
  __shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_18;
  uint32_t size;
  BufferPtr *val_local;
  BinaryReader *this_local;
  
  p_Stack_18 = (__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)val;
  val_local = &this->m_buffer;
  peVar1 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  Buffer::Read(peVar1,&this->m_pos,&local_1c,4);
  peVar1 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Stack_18);
  Buffer::Reserve(peVar1,(ulong)local_1c);
  peVar1 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  Buffer::Read(peVar1,&this->m_pos,(BufferPtr *)p_Stack_18,(ulong)local_1c);
  return;
}

Assistant:

inline_t void BinaryReader::Read(BufferPtr & val)
	{
		uint32_t size;
		m_buffer->Read(&m_pos, &size, sizeof(size));
		val->Reserve(size);
		m_buffer->Read(&m_pos, val, size);
	}